

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall QLocale::percent(QString *__return_storage_ptr__,QLocale *this)

{
  QLocaleData::percentSign(__return_storage_ptr__,((this->d).d.ptr)->m_data);
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::percent() const
{
    return d->m_data->percentSign();
}